

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::UniversalPrinter<float>::Print(float *value,ostream *os)

{
  float val;
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  
  val = *value;
  lVar1 = *(long *)(*(long *)os + -0x18);
  uVar2 = *(undefined8 *)(os + lVar1 + 8);
  iVar3 = AppropriateResolution<float>(val);
  *(long *)(os + lVar1 + 8) = (long)iVar3;
  std::ostream::_M_insert<double>((double)val);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar2;
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }